

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O2

void __thiscall Al::internal::ProgressEngine::ProgressEngine(ProgressEngine *this)

{
  long lVar1;
  
  (this->thread)._M_id._M_thread = 0;
  (this->startup_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->startup_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->startup_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->startup_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->startup_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->startup_cv);
  lVar1 = 0x80;
  do {
    InputQueue::InputQueue((InputQueue *)((long)this->request_queues + lVar1 + -0x80));
    lVar1 = lVar1 + 0x200;
  } while (lVar1 != 0x8080);
  (this->run_queues)._M_h._M_buckets = &(this->run_queues)._M_h._M_single_bucket;
  (this->run_queues)._M_h._M_bucket_count = 1;
  (this->run_queues)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->run_queues)._M_h._M_element_count = 0;
  (this->run_queues)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->num_bounded = 0;
  (this->run_queues)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->run_queues)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->core_to_bind = -1;
  LOCK();
  (this->stop_flag)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->started_flag)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->doing_start_flag)._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->num_input_streams).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  bind_init(this);
  return;
}

Assistant:

ProgressEngine::ProgressEngine() {
  stop_flag = false;
  started_flag = false;
#ifdef AL_PE_START_ON_DEMAND
  doing_start_flag = false;
#endif
#ifdef AL_PE_ADD_DEFAULT_STREAM
  // Initialze with the default stream.
  num_input_streams = 1;
#else
  num_input_streams = 0;
#endif
#ifdef AL_HAS_CUDA
  // Capture the current CUDA device for the progress engine.
  int device;
  AL_CHECK_CUDA(AlGpuGetDevice(&device));
  cur_device = device;
#endif
#ifdef AL_USE_HWLOC
  bind_init();
#endif
}